

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.cpp
# Opt level: O1

bool cppcms::encoding::validate_or_filter
               (string *encoding,char *begin,char *end,string *output,char replace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  const_iterator cVar8;
  code *pcVar9;
  string tmp_out;
  string utf8_string;
  size_t tmp_count;
  string local_b8;
  char *local_98;
  long local_90;
  char local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  size_t local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar2 = (encoding->_M_dataplus)._M_p;
  bVar5 = impl::encodings_comparator::operator()((encodings_comparator *)&local_98,pcVar2,"utf8");
  if ((bVar5) ||
     (bVar5 = impl::encodings_comparator::operator()
                        ((encodings_comparator *)&local_98,"utf8",pcVar2), bVar5)) {
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>,_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>,_cppcms::encoding::impl::encodings_comparator,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool_(*)(const_char_*,_const_char_*,_unsigned_long_&)>_>_>
                    *)impl::all_validators,encoding);
    if (cVar8._M_node == (_Base_ptr)(impl::all_validators + 8)) {
      pcVar9 = (code *)0x0;
    }
    else {
      pcVar9 = *(code **)(cVar8._M_node + 2);
    }
    if (pcVar9 == (code *)0x0) {
      local_58 = 0;
      cVar6 = valid(encoding,begin,end,&local_58);
      if (!(bool)cVar6) {
        paVar1 = &local_b8.field_2;
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"UTF-8","");
        booster::locale::conv::between
                  ((char *)&local_98,begin,(string *)end,(string *)&local_b8,(method_type)encoding);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        local_b8._M_string_length = 0;
        local_b8.field_2._M_local_buf[0] = '\0';
        local_b8._M_dataplus._M_p = (pointer)paVar1;
        bVar5 = anon_unknown_17::validate_or_filter_utf8
                          (local_98,local_98 + local_90,&local_b8,'\0');
        if (bVar5) {
          std::__cxx11::string::swap((string *)&local_b8);
        }
        sVar4 = local_b8._M_string_length;
        _Var3._M_p = local_b8._M_dataplus._M_p;
        local_78[0] = local_68;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"UTF-8","");
        booster::locale::conv::between
                  ((char *)local_50,_Var3._M_p,(string *)(_Var3._M_p + sVar4),(string *)encoding,
                   (method_type)local_78);
        std::__cxx11::string::operator=((string *)output,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        if (local_78[0] != local_68) {
          operator_delete(local_78[0]);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p);
        }
        if (local_98 != local_88) {
          operator_delete(local_98);
        }
      }
    }
    else {
      local_98 = (char *)0x0;
      cVar6 = (*pcVar9)(begin,end);
      if (cVar6 == '\0') {
        output->_M_string_length = 0;
        *(output->_M_dataplus)._M_p = '\0';
        std::__cxx11::string::reserve((ulong)output);
        if (begin < end) {
          do {
            local_b8._M_dataplus._M_p = (pointer)0x0;
            pcVar2 = begin + 1;
            cVar7 = (*pcVar9)(begin,pcVar2,&local_b8);
            if ((cVar7 != '\0') || (replace != '\0')) {
              std::__cxx11::string::push_back((char)output);
            }
            begin = pcVar2;
          } while (pcVar2 != end);
        }
      }
    }
  }
  else {
    cVar6 = anon_unknown_17::validate_or_filter_utf8(begin,end,output,replace);
  }
  return (bool)cVar6;
}

Assistant:

bool CPPCMS_API validate_or_filter(	std::string const &encoding,
					char const *begin,char const *end,
					std::string &output,
					char replace)
{
	/// UTF-8 Case
	if(is_utf8(encoding.c_str()))
		return validate_or_filter_utf8(begin,end,output,replace);

	/// 8bit case
	impl::validators_set::encoding_tester_type tester = impl::all_validators.get(encoding);
	if(tester)
		return validate_or_filter_single_byte_charset(tester,begin,end,output,replace);

	size_t tmp_count = 0;
	/// Most common case
	if(valid(encoding,begin,end,tmp_count))
		return true;

	std::string utf8_string = booster::locale::conv::between(
			begin,end,
			"UTF-8",encoding,
			booster::locale::conv::skip);

	std::string tmp_out;

	if(validate_or_filter_utf8(utf8_string.c_str(),utf8_string.c_str() + utf8_string.size(),tmp_out,0)) {
		tmp_out.swap(utf8_string);
	}

	output = booster::locale::conv::between(
			tmp_out.c_str(),
			tmp_out.c_str()+tmp_out.size(),
			encoding,
			"UTF-8",
			booster::locale::conv::skip);
	return false;
}